

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O0

void connection_close_cb(uv_handle_t *handle)

{
  void *__ptr;
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  connection_context_t *context;
  uv_handle_t *handle_local;
  
  __ptr = handle->data;
  iVar1 = *(int *)((long)__ptr + 0x114) + -1;
  *(int *)((long)__ptr + 0x114) = iVar1;
  if (iVar1 == 0) {
    if ((test_mode == DUPLEX) || (*(int *)((long)__ptr + 0x110) != 0)) {
      if (*(long *)((long)__ptr + 0x100) != 0x10000) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
                ,0xb7,"context->read","==","(1 << 16)",*(long *)((long)__ptr + 0x100),"==",0x10000);
        abort();
      }
    }
    else if (*(long *)((long)__ptr + 0x100) != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
              ,0xb9,"context->read","==","0",*(long *)((long)__ptr + 0x100),"==",0);
      abort();
    }
    if ((test_mode == DUPLEX) || (*(int *)((long)__ptr + 0x110) == 0)) {
      if (*(long *)((long)__ptr + 0x108) != 0x10000) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
                ,0xbd,"context->sent","==","(1 << 16)",*(long *)((long)__ptr + 0x108),"==",0x10000);
        abort();
      }
    }
    else if (*(long *)((long)__ptr + 0x108) != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
              ,0xbf,"context->sent","==","0",*(long *)((long)__ptr + 0x108),"==",0);
      abort();
    }
    closed_connections = closed_connections + 1;
    free(__ptr);
  }
  return;
}

Assistant:

static void connection_close_cb(uv_handle_t* handle) {
  connection_context_t* context = (connection_context_t*) handle->data;

  if (--context->open_handles == 0) {
    if (test_mode == DUPLEX || context->is_server_connection) {
      ASSERT_EQ(context->read, TRANSFER_BYTES);
    } else {
      ASSERT_OK(context->read);
    }

    if (test_mode == DUPLEX || !context->is_server_connection) {
      ASSERT_EQ(context->sent, TRANSFER_BYTES);
    } else {
      ASSERT_OK(context->sent);
    }

    closed_connections++;

    free(context);
  }
}